

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

int http1_on_body_chunk(http1_parser_s *parser,char *data,size_t data_len)

{
  FIOBJ FVar1;
  size_t data_len_local;
  char *data_local;
  http1_parser_s *parser_local;
  
  if ((*(long *)(*(long *)&parser[-1].state.reserved + 0x40) < (parser->state).content_length) ||
     (*(long *)(*(long *)&parser[-1].state.reserved + 0x40) < (parser->state).read)) {
    http_send_error((http_s *)(parser + 1),0x19d);
    parser_local._4_4_ = -1;
  }
  else {
    if ((parser->state).read == 0) {
      if (((parser->state).content_length < 1) || (0x2000 < (parser->state).content_length)) {
        FVar1 = fiobj_data_newtmpfile();
        *(FIOBJ *)&parser[3].state.reserved = FVar1;
      }
      else {
        FVar1 = fiobj_data_newstr();
        *(FIOBJ *)&parser[3].state.reserved = FVar1;
      }
    }
    fiobj_data_write(*(FIOBJ *)&parser[3].state.reserved,data,data_len);
    parser_local._4_4_ = 0;
  }
  return parser_local._4_4_;
}

Assistant:

static int http1_on_body_chunk(http1_parser_s *parser, char *data,
                               size_t data_len) {
  if (parser->state.content_length >
          (ssize_t)parser2http(parser)->p.settings->max_body_size ||
      parser->state.read >
          (ssize_t)parser2http(parser)->p.settings->max_body_size) {
    http_send_error(&http1_pr2handle(parser2http(parser)), 413);
    return -1; /* test every time, in case of chunked data */
  }
  if (!parser->state.read) {
    if (parser->state.content_length > 0 &&
        parser->state.content_length <= HTTP_MAX_HEADER_LENGTH) {
      http1_pr2handle(parser2http(parser)).body = fiobj_data_newstr();
    } else {
      http1_pr2handle(parser2http(parser)).body = fiobj_data_newtmpfile();
    }
  }
  fiobj_data_write(http1_pr2handle(parser2http(parser)).body, data, data_len);
  return 0;
}